

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O0

bool spvtools::opt::isPackingHlsl(PackingRules rules)

{
  bool local_9;
  PackingRules rules_local;
  
  local_9 = rules == HlslCbuffer || rules == HlslCbufferPackOffset;
  return local_9;
}

Assistant:

static bool isPackingHlsl(StructPackingPass::PackingRules rules) {
  switch (rules) {
    case StructPackingPass::PackingRules::HlslCbuffer:
    case StructPackingPass::PackingRules::HlslCbufferPackOffset:
      return true;
    default:
      return false;
  }
}